

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

void des3_sdctr_encrypt_decrypt(ssh_cipher *ciph,void *vdata,int len)

{
  bool bVar1;
  LR LVar2;
  LR a;
  ssh_cipheralg *psVar3;
  LR output;
  LR input;
  LR keystream;
  LR lr;
  BignumDblInt ADC_temp;
  ulong uStack_48;
  uint i_1;
  BignumCarry carry;
  undefined1 local_38 [4];
  uint i;
  uint8_t iv_buf [8];
  uint8_t *data;
  des3_sdctr_ctx *ctx;
  int len_local;
  void *vdata_local;
  ssh_cipher *ciph_local;
  
  iv_buf = (uint8_t  [8])vdata;
  for (ctx._4_4_ = len; 0 < ctx._4_4_; ctx._4_4_ = ctx._4_4_ + -8) {
    bVar1 = false;
    while (!bVar1) {
      PUT_64BIT_MSB_FIRST(local_38,(uint64_t)ciph[-1].vt);
      bVar1 = true;
    }
    uStack_48 = 1;
    bVar1 = false;
    while (!bVar1) {
      psVar3 = (ssh_cipheralg *)((long)&(ciph[-1].vt)->new + uStack_48);
      uStack_48 = (ulong)CARRY8((ulong)ciph[-1].vt,uStack_48);
      ciph[-1].vt = psVar3;
      bVar1 = true;
    }
    LVar2 = des_load_lr(local_38);
    LVar2 = des_IP(LVar2);
    LVar2 = des_inner_cipher(LVar2,(des_keysched *)(ciph + -0x31),0,1);
    LVar2 = des_inner_cipher(LVar2,(des_keysched *)(ciph + -0x21),0xf,0xffffffffffffffff);
    LVar2 = des_inner_cipher(LVar2,(des_keysched *)(ciph + -0x11),0,1);
    LVar2 = des_FP(LVar2);
    a = des_load_lr((void *)iv_buf);
    LVar2 = des_xor_lr(a,LVar2);
    des_store_lr((void *)iv_buf,LVar2);
    iv_buf = (uint8_t  [8])((long)iv_buf + 8);
  }
  smemclr(local_38,8);
  return;
}

Assistant:

static void des3_sdctr_encrypt_decrypt(ssh_cipher *ciph, void *vdata, int len)
{
    struct des3_sdctr_ctx *ctx = container_of(
        ciph, struct des3_sdctr_ctx, ciph);
    uint8_t *data = (uint8_t *)vdata;
    uint8_t iv_buf[8];
    for (; len > 0; len -= 8, data += 8) {
        /* Format the counter value into the buffer. */
        for (unsigned i = 0; i < SDCTR_WORDS; i++)
            PUT_BIGNUMINT_MSB_FIRST(
                iv_buf + 8 - BIGNUM_INT_BYTES - i*BIGNUM_INT_BYTES,
                ctx->counter[i]);

        /* Increment the counter. */
        BignumCarry carry = 1;
        for (unsigned i = 0; i < SDCTR_WORDS; i++)
            BignumADC(ctx->counter[i], carry, ctx->counter[i], 0, carry);

        /* Triple-encrypt the counter value from the IV. */
        LR lr = des_IP(des_load_lr(iv_buf));
        lr = des_inner_cipher(lr, &ctx->sched[0], ENCIPHER);
        lr = des_inner_cipher(lr, &ctx->sched[1], DECIPHER);
        lr = des_inner_cipher(lr, &ctx->sched[2], ENCIPHER);
        LR keystream = des_FP(lr);

        LR input = des_load_lr(data);
        LR output = des_xor_lr(input, keystream);
        des_store_lr(data, output);
    }
    smemclr(iv_buf, sizeof(iv_buf));
}